

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmalloc.cc
# Opt level: O2

size_t nallocx_slow(size_t size,int flags)

{
  ulong uVar1;
  size_t sVar2;
  Length LVar3;
  sbyte sVar4;
  int iVar5;
  ulong uVar6;
  
  if (tcmalloc::Static::inited_ == '\0') {
    tcmalloc::ThreadCache::InitModule();
  }
  uVar6 = 1L << (sbyte)(flags & 0x3fU);
  if ((flags & 0x3fU) < 0xe) {
    uVar1 = -uVar6 & (size + uVar6) - 1;
    if ((uVar1 == 0) && (uVar1 = uVar6, size != 0)) {
      uVar1 = size;
    }
    if (uVar1 < 0x401) {
      sVar4 = 3;
      iVar5 = 7;
    }
    else {
      if (0x40000 < uVar1) goto LAB_001142bc;
      sVar4 = 7;
      iVar5 = 0x3c7f;
    }
    sVar2 = (size_t)(int)(&DAT_0012ea44)
                         [(byte)(&tcmalloc::Static::sizemap_)[(uint)((int)uVar1 + iVar5) >> sVar4]];
  }
  else {
LAB_001142bc:
    LVar3 = tcmalloc::PageHeap::RoundUpSize
                      ((PageHeap *)tcmalloc::Static::pageheap_,
                       ((size >> 0xd) + 1) - (ulong)((size & 0x1fff) == 0));
    sVar2 = LVar3 << 0xd;
  }
  return sVar2;
}

Assistant:

static ATTRIBUTE_NOINLINE size_t nallocx_slow(size_t size, int flags) {
  if (PREDICT_FALSE(!Static::IsInited())) ThreadCache::InitModule();

  size_t align = static_cast<size_t>(1ull << (flags & 0x3f));
  uint32_t cl;
  bool ok = size_class_with_alignment(size, align, &cl);
  if (ok) {
    return Static::sizemap()->ByteSizeForClass(cl);
  } else {
    Length pages = tcmalloc::pages(size);
    pages = Static::pageheap()->RoundUpSize(pages);
    return pages << kPageShift;
  }
}